

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::ActiveTipChange
          (PeerManagerImpl *this,CBlockIndex *new_tip,bool is_ibd)

{
  long lVar1;
  byte bVar2;
  byte in_DL;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RSI;
  CRollingBloomFilter *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock39;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  PeerManagerImpl *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  AssertLockNotHeldInline
            (in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             (RecursiveMutex *)0x105e6b5);
  AssertLockNotHeldInline
            (in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             (Mutex *)0x105e6d9);
  if ((bVar2 & 1) == 0) {
    MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (in_RSI,(AnnotatedMixin<std::mutex> *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
    RecentRejectsFilter(in_stack_ffffffffffffffa0);
    CRollingBloomFilter::reset(in_RDI);
    RecentRejectsReconsiderableFilter(in_stack_ffffffffffffffa0);
    CRollingBloomFilter::reset(in_RDI);
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ActiveTipChange(const CBlockIndex& new_tip, bool is_ibd)
{
    // Ensure mempool mutex was released, otherwise deadlock may occur if another thread holding
    // m_tx_download_mutex waits on the mempool mutex.
    AssertLockNotHeld(m_mempool.cs);
    AssertLockNotHeld(m_tx_download_mutex);

    if (!is_ibd) {
        LOCK(m_tx_download_mutex);
        // If the chain tip has changed, previously rejected transactions might now be valid, e.g. due
        // to a timelock. Reset the rejection filters to give those transactions another chance if we
        // see them again.
        RecentRejectsFilter().reset();
        RecentRejectsReconsiderableFilter().reset();
    }
}